

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

LispPTR reclaimarrayblock(LispPTR ptr)

{
  ushort uVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  LispPTR *pLVar4;
  bool bVar5;
  int reclaim_p;
  LispPTR *tmpp;
  arrayblock *base;
  LispPTR btrailer;
  LispPTR tmpptr;
  LispPTR ptr_local;
  
  bVar5 = true;
  pLVar3 = NativeAligned4FromLAddr(ptr - 2);
  if ((((ptr & 0xfff0000) >> 0x10 < 0x13) || (*(ushort *)((long)pLVar3 + 2) >> 3 != 0x1555)) ||
     ((*pLVar3 & 0x10000) == 0)) {
    error("Bad array block reclaimed--continue with \'q\' but save state ASAP. \n");
  }
  else {
    uVar1 = *(ushort *)((long)pLVar3 + 2) >> 1 & 3;
    if (uVar1 == 1) {
      LVar2 = *pLVar3;
      base._4_4_ = ptr;
      do {
        pLVar4 = NativeAligned4FromLAddr(base._4_4_);
        if (((*(ushort *)((ulong)(MDStypetbl + (*pLVar4 >> 9)) ^ 2) & 0x8000) == 0) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(*pLVar4,1);
        }
        *pLVar4 = 0;
        base._4_4_ = base._4_4_ + 2;
      } while (base._4_4_ != (ptr - 2) + ((ushort)LVar2 - 1) * 2);
    }
    else if (uVar1 == 2) {
      LVar2 = reclaimcodeblock(ptr);
      bVar5 = LVar2 == 0;
    }
    if (bVar5) {
      LVar2 = makefreearrayblock(ptr - 2,(DLword)*pLVar3);
      LVar2 = mergebackward(LVar2);
      mergeforward(LVar2);
    }
  }
  return 1;
}

Assistant:

LispPTR reclaimarrayblock(LispPTR ptr) {
  LispPTR tmpptr, btrailer;
  struct arrayblock *base;
  LispPTR *tmpp;
  int reclaim_p;

  reclaim_p = T;
#ifdef ARRAYCHECK
  checkarrayblock(ptr - ARRAYBLOCKHEADERWORDS, NIL, NIL);
#endif /* ARRAYCHECK */

  base = (struct arrayblock *)NativeAligned4FromLAddr(ptr - ARRAYBLOCKHEADERWORDS);
#ifdef ARRAYCHECK
  if (HILOC(ptr) < FIRSTARRAYSEGMENT) {
    printarrayblock(ptr - ARRAYBLOCKHEADERWORDS);
    error(
        "Bad array block reclaimed [not in array space].\nContinue with 'q' but save state ASAP. "
        "\n");
    return (T);
  } else if (ARRAYBLOCKPASSWORD != base->password) {
    printarrayblock(ptr - ARRAYBLOCKHEADERWORDS);
    error("Bad array block reclaimed [password wrong].\nContinue with 'q' but save state ASAP. \n");
    return (T);
  } else if (base->inuse == NIL) {
    printarrayblock(ptr - ARRAYBLOCKHEADERWORDS);
    error(
        "Bad array block reclaimed [block not in use].\nContinue with 'q' but save state ASAP. \n");
    return (T);
  }
#else
  /* Normal case, just tell the guy something's wrong: */
  if ((HILOC(ptr) < FIRSTARRAYSEGMENT) ||
      ((ARRAYBLOCKPASSWORD != base->password) || (base->inuse == NIL))) {
    error("Bad array block reclaimed--continue with 'q' but save state ASAP. \n");
    return (T);
  }
#endif /* ARRAYCHECK */

  switch (base->gctype) {
    case PTRBLOCK_GCT: {
      btrailer = (ptr - 2) + 2 * (base->arlen - ARRAYBLOCKTRAILERCELLS);
      tmpptr = ptr;
      do {
        tmpp = (LispPTR *)NativeAligned4FromLAddr(tmpptr);
        /* GCLOOKUP(0x8000,DELREF, *tmpp);*/ /* added 8-Oct-87 TT */
        REC_GCLOOKUP(*tmpp, DELREF);
        *tmpp = NIL;
        tmpptr += 2;
      } while (tmpptr != btrailer);
      break;
    }
    case CODEBLOCK_GCT:
      reclaim_p = ((reclaimcodeblock(ptr) == NIL) ? T : NIL);

      /* default:   No Action */
  }
  if (reclaim_p == T)
    mergeforward(mergebackward(makefreearrayblock(ptr - ARRAYBLOCKHEADERWORDS, base->arlen)));
  return (T);
}